

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

HRESULT __thiscall
Js::ByteCodeBufferBuilder::AddOneScopeInfo
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,ScopeInfo *scopeInfo,
          LocalScopeInfoId parentId)

{
  PropertyId id;
  FunctionInfo *pFVar1;
  code *pcVar2;
  undefined4 *puVar3;
  ByteCodeBufferBuilder *pBVar4;
  bool bVar5;
  PropertyId value;
  BufferBuilder *pBVar6;
  ImmutableList<Js::BufferBuilder_*> *pIVar7;
  ScopeInfo *pSVar8;
  BufferBuilderInt32 *pBVar9;
  int value_00;
  uint uVar10;
  BufferBuilderList *builder_00;
  ScopeInfo *pSVar11;
  BufferBuilderInt32 *local_60;
  BufferBuilderInt32 *startOfScopeInfo;
  undefined4 *local_50;
  ByteCodeBufferBuilder *local_48;
  BufferBuilderList *local_40;
  LocalScopeInfoId local_34;
  
  local_60 = (BufferBuilderInt32 *)0x0;
  local_40 = builder;
  local_34 = parentId;
  PrependInt32(this,builder,L"ScopeInfo symbol count",scopeInfo->symbolCount,&local_60);
  value_00 = 0;
  pBVar6 = (BufferBuilder *)new<Memory::ArenaAllocator>(0x28,this->alloc,0x35916e);
  pBVar6->clue = L"Offset To ScopeInfo";
  pBVar6->offset = 0xffffffff;
  pBVar6->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_0137a2f0;
  pBVar6[1]._vptr_BufferBuilder = (_func_int **)local_60;
  *(undefined4 *)&pBVar6[1].clue = 0;
  pIVar7 = regex::ImmutableList<Js::BufferBuilder_*>::Prepend
                     ((this->scopeInfoRelativeOffsets).list,pBVar6,this->alloc);
  builder_00 = local_40;
  (this->scopeInfoRelativeOffsets).list = pIVar7;
  pFVar1 = (scopeInfo->functionInfo).ptr;
  if (pFVar1 != (FunctionInfo *)0x0) {
    value_00 = pFVar1->functionId - this->topFunctionId;
  }
  PrependInt32(this,local_40,L"ScopeInfo FunctionInfo relative id",value_00,
               (BufferBuilderInt32 **)0x0);
  uVar10 = *(ushort *)&scopeInfo->field_0x10 >> 1 & 0x70 | *(ushort *)&scopeInfo->field_0x10 & 0xf;
  PrependByte(this,builder_00,L"ScopeInfo flags",(byte)uVar10);
  PrependInt32(this,builder_00,L"ScopeInfo scope type",scopeInfo->scopeType,
               (BufferBuilderInt32 **)0x0);
  PrependInt32(this,builder_00,L"ScopeInfo scope id",scopeInfo->scopeId,(BufferBuilderInt32 **)0x0);
  if (DAT_0145948a == '\x01') {
    Output::Trace(ByteCodeSerializationPhase,
                  L"Adding ScopeInfo (0x%p). Flags: %u. Type: %d. ScopeId: %d. Symbol count: %u\n",
                  scopeInfo,(ulong)uVar10,(ulong)scopeInfo->scopeType,
                  (ulong)(uint)scopeInfo->scopeId,scopeInfo->symbolCount);
  }
  pSVar11 = scopeInfo + 1;
  local_50 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  pBVar9 = (BufferBuilderInt32 *)0x0;
  local_48 = this;
  do {
    pBVar4 = local_48;
    if ((long)scopeInfo->symbolCount <= (long)pBVar9) {
      pSVar11 = (scopeInfo->parent).ptr;
      PrependBool(local_48,builder_00,L"ScopeInfo has parent",pSVar11 != (ScopeInfo *)0x0);
      if (pSVar11 != (ScopeInfo *)0x0) {
        pBVar6 = (BufferBuilder *)new<Memory::ArenaAllocator>(0x18,pBVar4->alloc,0x35916e);
        pBVar6->clue = L"ScopeInfo parent LocalId";
        *(undefined8 *)&pBVar6->offset = 0xffffffffffffffff;
        pBVar6->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_0137a2b8;
        pIVar7 = regex::ImmutableList<Js::BufferBuilder_*>::Prepend
                           (builder_00->list,pBVar6,pBVar4->alloc);
        builder_00->list = pIVar7;
        if (local_34 == 0xffffffff) {
          local_34 = GetScopeInfoId(pBVar4,(scopeInfo->parent).ptr);
        }
        *(LocalScopeInfoId *)&pBVar6->field_0x14 = local_34;
      }
      return 0;
    }
    uVar10 = *(byte *)((long)&(pSVar11->functionInfo).ptr + 1) & 0x3f;
    startOfScopeInfo = pBVar9;
    PrependByte(local_48,builder_00,L"SymbolInfo flags",(byte)uVar10);
    PrependByte(pBVar4,builder_00,L"SymbolInfo symbol type",*(byte *)&(pSVar11->functionInfo).ptr);
    pSVar8 = pSVar11;
    if ((scopeInfo->field_0x10 & 0x10) != 0) {
      pSVar8 = (pSVar11->parent).ptr;
      if (pSVar8 == (ScopeInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = local_50;
        *local_50 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                    ,0x9c6,"(sym->name != nullptr)","sym->name != nullptr");
        if (!bVar5) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar3 = 0;
        pSVar8 = (pSVar11->parent).ptr;
      }
      pSVar8 = (ScopeInfo *)&pSVar8->functionInfo;
    }
    pBVar4 = local_48;
    id = *(PropertyId *)&(pSVar8->parent).ptr;
    value = encodePossiblyBuiltInPropertyId(local_48,id);
    builder_00 = local_40;
    PrependInt32(pBVar4,local_40,L"SymbolInfo property id",value,(BufferBuilderInt32 **)0x0);
    if (DAT_0145948a == '\x01') {
      Output::Trace(ByteCodeSerializationPhase,
                    L"\t\tSymbolInfo (0x%p). Flags: %u. Type: %d. PropertyId: %u (%u)\n",pSVar11,
                    (ulong)uVar10,(ulong)*(byte *)&(pSVar11->functionInfo).ptr,
                    (ulong)*(uint *)&(pSVar11->parent).ptr,id);
    }
    pBVar9 = (BufferBuilderInt32 *)
             ((long)&(startOfScopeInfo->super_BufferBuilder)._vptr_BufferBuilder + 1);
    pSVar11 = (ScopeInfo *)&pSVar11->field_0x10;
  } while( true );
}

Assistant:

HRESULT AddOneScopeInfo(BufferBuilderList & builder, ScopeInfo* scopeInfo, LocalScopeInfoId parentId = InvalidLocalScopeInfoId)
    {
        BufferBuilderInt32* startOfScopeInfo = nullptr;
        PrependInt32(builder, _u("ScopeInfo symbol count"), scopeInfo->symbolCount, &startOfScopeInfo);

        BufferBuilderRelativeOffset* offsetToScopeInfo = Anew(alloc, BufferBuilderRelativeOffset, _u("Offset To ScopeInfo"), startOfScopeInfo);
        this->scopeInfoRelativeOffsets.list = this->scopeInfoRelativeOffsets.list->Prepend(offsetToScopeInfo, alloc);

        FunctionInfo* functionInfo = scopeInfo->functionInfo;
        uint relativeFunctionId = 0;
        if (functionInfo != nullptr)
        {
            relativeFunctionId = functionInfo->GetLocalFunctionId() - topFunctionId;
        }
        PrependUInt32(builder, _u("ScopeInfo FunctionInfo relative id"), relativeFunctionId);

        ScopeInfoFlags scopeInfoFlags = (ScopeInfoFlags)
            ((scopeInfo->isDynamic ? sifIsDynamic : sifNone)
                | (scopeInfo->isObject ? sifIsObject : sifNone)
                | (scopeInfo->mustInstantiate ? sifMustInstantiate : sifNone)
                | (scopeInfo->isCached ? sifIsCached : sifNone)
                | (scopeInfo->hasLocalInClosure ? sifHasLocalInClosure : sifNone)
                | (scopeInfo->isGeneratorFunctionBody ? sifIsGeneratorFunctionBody : sifNone)
                | (scopeInfo->isAsyncFunctionBody ? sifIsAsyncFunctionBody : sifNone));

        PrependByte(builder, _u("ScopeInfo flags"), scopeInfoFlags);
        PrependInt32(builder, _u("ScopeInfo scope type"), scopeInfo->scopeType);
        PrependInt32(builder, _u("ScopeInfo scope id"), scopeInfo->scopeId);

        OUTPUT_VERBOSE_TRACE(Js::ByteCodeSerializationPhase, _u("Adding ScopeInfo (0x%p). Flags: %u. Type: %d. ScopeId: %d. Symbol count: %u\n"), scopeInfo, scopeInfoFlags, scopeInfo->scopeType, scopeInfo->scopeId, scopeInfo->symbolCount);

        for (int i = 0; i < scopeInfo->symbolCount; i++)
        {
            ScopeInfo::SymbolInfo* sym = scopeInfo->symbols + i;

            SymbolInfoFlags symbolInfoFlags = (SymbolInfoFlags)
                ((sym->hasFuncAssignment ? syifHasFuncAssignment : syifNone)
                    | (sym->isBlockVariable ? syifIsBlockVariable : syifNone)
                    | (sym->isConst ? syifIsConst : syifNone)
                    | (sym->isFuncExpr ? syifIsFuncExpr : syifNone)
                    | (sym->isModuleExportStorage ? syifIsModuleExportStorage : syifNone)
                    | (sym->isModuleImport ? syifIsModuleImport : syifNone));

            PrependByte(builder, _u("SymbolInfo flags"), symbolInfoFlags);
            PrependByte(builder, _u("SymbolInfo symbol type"), (BYTE)sym->symbolType);

            PropertyId symPropertyId = sym->propertyId;
            if (scopeInfo->areNamesCached)
            {
                Assert(sym->name != nullptr);
                symPropertyId = sym->name->GetPropertyId();
            }

            PropertyId propertyId = encodePossiblyBuiltInPropertyId(symPropertyId);
            PrependInt32(builder, _u("SymbolInfo property id"), propertyId);

            OUTPUT_VERBOSE_TRACE(Js::ByteCodeSerializationPhase, _u("\t\tSymbolInfo (0x%p). Flags: %u. Type: %d. PropertyId: %u (%u)\n"), sym, symbolInfoFlags, sym->symbolType, sym->propertyId, symPropertyId);
        }

        bool hasParent = scopeInfo->parent != nullptr;
        PrependBool(builder, _u("ScopeInfo has parent"), hasParent);

        if (hasParent)
        {
            // Prepend an int32 here as a placeholder in case we need to add more bytes into builder for the parent
            auto entry = Anew(alloc, BufferBuilderInt32, _u("ScopeInfo parent LocalId"), InvalidLocalScopeInfoId);
            builder.list = builder.list->Prepend(entry, alloc);

            // If we were not passed a valid pointer id, try and look it up in the map
            if (parentId == InvalidLocalScopeInfoId)
            {
                parentId = GetScopeInfoId(scopeInfo->parent);
            }

            // Update our placeholder with the real id of the parent
            entry->value = parentId;
        }

        return S_OK;
    }